

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O1

void object_wipe(object *obj)

{
  mem_free(obj->slays);
  mem_free(obj->brands);
  mem_free(obj->curses);
  memset(obj,0,0x138);
  return;
}

Assistant:

void object_wipe(struct object *obj)
{
	/* Free slays and brands */
	mem_free(obj->slays);
	mem_free(obj->brands);
	mem_free(obj->curses);

	/* Wipe the structure */
	memset(obj, 0, sizeof(*obj));
}